

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qreadwritelock.cpp
# Opt level: O2

void __thiscall QReadWriteLockPrivate::release(QReadWriteLockPrivate *this)

{
  uint uVar1;
  __pointer_type pQVar2;
  int iVar3;
  Type *pTVar4;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_qrwl_freelist>_>
           ::instance();
  uVar5 = this->id & 0xffffff;
  local_24 = uVar5;
  iVar3 = QFreeList<QReadWriteLockPrivate,_(anonymous_namespace)::QReadWriteLockFreeListConstants>::
          blockfor((int *)&local_24);
  pQVar2 = pTVar4->_v[iVar3].super_QBasicAtomicPointer<QFreeListElement<QReadWriteLockPrivate>_>.
           _q_value._M_b._M_p;
  do {
    uVar1 = (pTVar4->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    pQVar2[(int)local_24].next.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value =
         (Type)(uVar1 & 0xffffff);
    LOCK();
    bVar6 = uVar1 == (pTVar4->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                     _q_value.super___atomic_base<int>._M_i;
    if (bVar6) {
      (pTVar4->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = uVar1 + 0x1000000 & 0x7f000000 | uVar5;
    }
    UNLOCK();
  } while (!bVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QReadWriteLockPrivate::release()
{
    Q_ASSERT(!recursive);
    Q_ASSERT(!waitingReaders && !waitingWriters && !readerCount && !writerCount);
    qrwl_freelist->release(id);
}